

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

size_t __thiscall
andres::
BinaryViewExpression<andres::BinaryViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
::size(BinaryViewExpression<andres::BinaryViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
       *this)

{
  expression_type_1 *peVar1;
  ulong uVar2;
  expression_type_2 *peVar3;
  ulong uVar4;
  ulong uVar5;
  
  peVar1 = this->e1_->e1_;
  uVar2 = (peVar1->e1_->geometry_).size_;
  uVar4 = (peVar1->e2_->geometry_).size_;
  if (uVar4 < uVar2) {
    uVar4 = uVar2;
  }
  peVar3 = this->e1_->e2_;
  uVar2 = (peVar3->e1_->e_->geometry_).size_;
  uVar5 = (peVar3->e2_->geometry_).size_;
  if (uVar5 < uVar2) {
    uVar5 = uVar2;
  }
  if (uVar5 < uVar4) {
    uVar5 = uVar4;
  }
  uVar2 = (this->e2_->e1_->geometry_).size_;
  uVar4 = (this->e2_->e2_->geometry_).size_;
  if (uVar4 < uVar2) {
    uVar4 = uVar2;
  }
  if (uVar4 < uVar5) {
    uVar4 = uVar5;
  }
  return uVar4;
}

Assistant:

const std::size_t size() const 
        { return e1_.size() < e2_.size() ? e2_.size() : e1_.size(); }